

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O2

void BuilderTests<TestHeapBuilder,_TestHeapBuilder>::builder_swap_after_finish_test(bool run)

{
  uint val;
  uint val_00;
  bool bVar1;
  Offset<MyGame::Example::Monster> OVar2;
  undefined7 in_register_00000039;
  string local_130;
  TestHeapBuilder dst;
  TestHeapBuilder src;
  
  if ((int)CONCAT71(in_register_00000039,run) != 0) {
    TestHeapBuilder::TestHeapBuilder((TestHeapBuilder *)&src.super_FlatBufferBuilder);
    OVar2 = populate1(&src.super_FlatBufferBuilder);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              (&src.super_FlatBufferBuilder,OVar2,(char *)0x0);
    val_00 = src.super_FlatBufferBuilder.buf_.size_;
    TestHeapBuilder::TestHeapBuilder(&dst);
    OVar2 = populate2(&dst.super_FlatBufferBuilder);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              (&dst.super_FlatBufferBuilder,OVar2,(char *)0x0);
    val = dst.super_FlatBufferBuilder.buf_.size_;
    flatbuffers::FlatBufferBuilderImpl<false>::Swap
              (&src.super_FlatBufferBuilder,&dst.super_FlatBufferBuilder);
    TestEq<unsigned_int,unsigned_int>
              (src.super_FlatBufferBuilder.buf_.size_,val,"\'src.GetSize()\' != \'size2\'",
               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
               ,0xc5,
               "static void BuilderTests<TestHeapBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
              );
    TestEq<unsigned_int,unsigned_int>
              (dst.super_FlatBufferBuilder.buf_.size_,val_00,"\'dst.GetSize()\' != \'size1\'",
               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
               ,0xc6,
               "static void BuilderTests<TestHeapBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
              );
    m2_name_abi_cxx11_();
    bVar1 = release_n_verify(&src.super_FlatBufferBuilder,&local_130,Color_Green);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'release_n_verify(src, m2_name(), m2_color())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
                      ,199,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_130);
    m1_name_abi_cxx11_();
    bVar1 = release_n_verify(&dst.super_FlatBufferBuilder,&local_130,Color_Red);
    TestEq<bool,bool>(true,bVar1,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
                      ,200,
                      "static void BuilderTests<TestHeapBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = TestHeapBuilder, SrcBuilder = TestHeapBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_130);
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&dst.super_FlatBufferBuilder);
    flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&src.super_FlatBufferBuilder);
  }
  return;
}

Assistant:

static void builder_swap_after_finish_test(
      bool run = std::is_same<DestBuilder, SrcBuilder>::value) {
    /// Swap is allowed only when lhs and rhs are the same concrete type.
    if (run) {
      SrcBuilder src;
      auto root_offset1 = populate1(src);
      src.Finish(root_offset1);
      auto size1 = src.GetSize();
      DestBuilder dst;
      auto root_offset2 = populate2(dst);
      dst.Finish(root_offset2);
      auto size2 = dst.GetSize();
      src.Swap(dst);
      TEST_EQ_FUNC(src.GetSize(), size2);
      TEST_EQ_FUNC(dst.GetSize(), size1);
      TEST_ASSERT_FUNC(release_n_verify(src, m2_name(), m2_color()));
      TEST_ASSERT_FUNC(release_n_verify(dst, m1_name(), m1_color()));
    }
  }